

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O3

void __thiscall FWallTmapVals::InitFromWallCoords(FWallTmapVals *this,FWallCoords *wallc)

{
  float fVar1;
  float fVar2;
  FWallCoords *pFVar3;
  FWallCoords *pFVar4;
  FVector2 *left;
  bool bVar5;
  float fVar6;
  
  bVar5 = (MirrorFlags & 1) == 0;
  fVar6 = (float)centerx;
  pFVar4 = (FWallCoords *)&wallc->tright;
  pFVar3 = wallc;
  if (!bVar5) {
    pFVar4 = wallc;
    pFVar3 = (FWallCoords *)&wallc->tright;
  }
  fVar1 = (&wallc->tleft)[MirrorFlags & 1].X;
  this->UoverZorg = fVar1 * fVar6;
  fVar2 = (pFVar3->tleft).Y;
  this->UoverZstep = -fVar2;
  this->InvZorg = (fVar1 - (&wallc->tleft)[bVar5].X) * fVar6;
  this->InvZstep = (pFVar4->tleft).Y - fVar2;
  return;
}

Assistant:

void FWallTmapVals::InitFromWallCoords(const FWallCoords *wallc)
{
	const FVector2 *left = &wallc->tleft;
	const FVector2 *right = &wallc->tright;

	if (MirrorFlags & RF_XFLIP)
	{
		swapvalues(left, right);
	}
	UoverZorg = left->X * centerx;
	UoverZstep = -left->Y;
	InvZorg = (left->X - right->X) * centerx;
	InvZstep = right->Y - left->Y;
}